

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.h
# Opt level: O0

void Abc_NtkIncrementTravId(Abc_Ntk_t *p)

{
  int iVar1;
  Abc_Ntk_t *p_local;
  
  if ((p->vTravIds).pArray == (int *)0x0) {
    iVar1 = Abc_NtkObjNumMax(p);
    Vec_IntFill(&p->vTravIds,iVar1 + 500,0);
  }
  p->nTravIds = p->nTravIds + 1;
  if (p->nTravIds < 0x40000000) {
    return;
  }
  __assert_fail("p->nTravIds < (1<<30)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abc.h"
                ,0x197,"void Abc_NtkIncrementTravId(Abc_Ntk_t *)");
}

Assistant:

static inline void        Abc_NtkIncrementTravId( Abc_Ntk_t * p )           { if (!p->vTravIds.pArray) Vec_IntFill(&p->vTravIds, Abc_NtkObjNumMax(p)+500, 0); p->nTravIds++; assert(p->nTravIds < (1<<30));  }